

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,Allocator *_allocator)

{
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Mat *pMVar1;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  int _w_00;
  Mat *in_stack_ffffffffffffffc0;
  int local_38;
  
  _w_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (in_RSI->w * in_RSI->h * in_RSI->c == in_EDX) {
    pMVar1 = in_RDI;
    if ((in_RSI->dims == 3) && (in_RSI->cstep != (long)in_RSI->w * (long)in_RSI->h)) {
      Mat(in_RDI);
      create(in_stack_ffffffffffffffc0,_w_00,
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (int)((ulong)in_RSI >> 0x20),(Allocator *)pMVar1);
      for (local_38 = 0; local_38 < in_RSI->c; local_38 = local_38 + 1) {
        memcpy((void *)((long)in_RDI->data +
                       (long)(local_38 * in_RSI->w * in_RSI->h) * in_RSI->elemsize),
               (void *)((long)in_RSI->data + (long)local_38 * in_RSI->cstep * in_RSI->elemsize),
               (long)(in_RSI->w * in_RSI->h) * in_RSI->elemsize);
      }
    }
    else {
      Mat(in_RDI,in_RSI);
      in_RDI->dims = 1;
      in_RDI->w = in_EDX;
      in_RDI->h = 1;
      in_RDI->c = 1;
      in_RDI->cstep = (long)in_EDX;
    }
  }
  else {
    Mat(in_RDI);
    pMVar1 = in_RDI;
  }
  return pMVar1;
}

Assistant:

inline Mat Mat::reshape(int _w, Allocator* _allocator) const
{
    if (w * h * c != _w)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, elemsize, elempack, _allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}